

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_1::AttachmentObjectCase::test(AttachmentObjectCase *this)

{
  CallLogWrapper *this_00;
  GLuint GVar1;
  GLuint renderbufferID;
  GLuint textureID;
  GLuint framebufferID;
  
  framebufferID = 0;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGenFramebuffers(this_00,1,&framebufferID);
  glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,framebufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  textureID = 0;
  glu::CallLogWrapper::glGenTextures(this_00,1,&textureID);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,textureID);
  glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,0x1908,0x40,0x40,0,0x1908,0x1401,(void *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  GVar1 = textureID;
  glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,textureID,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  checkColorAttachmentParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             0x8cd0,0x1702,GVar1);
  checkColorAttachmentParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             0x8cd1,textureID,GVar1);
  glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,0,0);
  glu::CallLogWrapper::glDeleteTextures(this_00,1,&textureID);
  renderbufferID = 0;
  glu::CallLogWrapper::glGenRenderbuffers(this_00,1,&renderbufferID);
  glu::CallLogWrapper::glBindRenderbuffer(this_00,0x8d41,renderbufferID);
  glu::CallLogWrapper::glRenderbufferStorage(this_00,0x8d41,0x8056,0x80,0x80);
  ApiCase::expectError(&this->super_ApiCase,0);
  GVar1 = renderbufferID;
  glu::CallLogWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,renderbufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  checkColorAttachmentParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             0x8cd0,0x8d41,GVar1);
  checkColorAttachmentParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             0x8cd1,renderbufferID,GVar1);
  glu::CallLogWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,0);
  glu::CallLogWrapper::glDeleteRenderbuffers(this_00,1,&renderbufferID);
  glu::CallLogWrapper::glDeleteFramebuffers(this_00,1,&framebufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		GLuint framebufferID = 0;
		glGenFramebuffers(1, &framebufferID);
		glBindFramebuffer(GL_FRAMEBUFFER, framebufferID);
		expectError(GL_NO_ERROR);

		// texture
		{
			GLuint textureID = 0;
			glGenTextures(1, &textureID);
			glBindTexture(GL_TEXTURE_2D, textureID);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, 64, 64, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
			expectError(GL_NO_ERROR);

			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, textureID, 0);
			expectError(GL_NO_ERROR);

			checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, GL_TEXTURE);
			checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME, textureID);

			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
			glDeleteTextures(1, &textureID);
		}

		// rb
		{
			GLuint renderbufferID = 0;
			glGenRenderbuffers(1, &renderbufferID);
			glBindRenderbuffer(GL_RENDERBUFFER, renderbufferID);
			glRenderbufferStorage(GL_RENDERBUFFER, GL_RGBA4, 128, 128);
			expectError(GL_NO_ERROR);

			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, renderbufferID);
			expectError(GL_NO_ERROR);

			checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, GL_RENDERBUFFER);
			checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME, renderbufferID);

			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, 0);
			glDeleteRenderbuffers(1, &renderbufferID);
		}

		glDeleteFramebuffers(1, &framebufferID);
		expectError(GL_NO_ERROR);
	}